

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_body.hpp
# Opt level: O0

void iutest::Test::RecordProperty<char_const*>(string *key,char **value)

{
  char **in_RDX;
  string local_38;
  char **local_18;
  char **value_local;
  string *key_local;
  
  local_18 = value;
  value_local = (char **)key;
  PrintToString<char_const*>(&local_38,(iutest *)value,in_RDX);
  RecordPropertyString(key,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

static void RecordProperty(const ::std::string& key, const T& value)
    {
        RecordPropertyString(key, PrintToString(value));
    }